

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

PackedFunc * __thiscall
tvm::runtime::TVMArgValue::operator_cast_to_PackedFunc
          (PackedFunc *__return_storage_ptr__,TVMArgValue *this)

{
  int *x;
  uint uVar1;
  ostream *poVar2;
  size_t sVar3;
  char *__s;
  LogCheckError _check_err;
  LogCheckError local_338;
  LogMessageFatal local_330;
  LogMessageFatal local_1a8;
  
  if ((this->super_TVMPODValue_).type_code_ == 4) {
    (__return_storage_ptr__->body_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->body_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->body_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->body_).super__Function_base._M_functor + 8) = 0;
  }
  else {
    x = &(this->super_TVMPODValue_).type_code_;
    local_1a8.log_stream_ = (ostringstream)0xa;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_338,x,(anon_enum_32 *)&local_1a8);
    if (local_338.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_330,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x243);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"type_code_ == kFuncHandle",0x19);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_330,((local_338.str)->_M_dataplus)._M_p,
                          (local_338.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," expected ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"FunctionHandle",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," but get ",9);
      uVar1 = *x;
      if ((ulong)uVar1 < 0xe) {
        __s = *(char **)(&DAT_0014ac18 + (ulong)uVar1 * 8);
      }
      else {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                   ,0x3ab);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"unknown type_code=",0x12);
        std::ostream::operator<<(&local_1a8,uVar1);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
        __s = "";
      }
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_330);
    }
    dmlc::LogCheckError::~LogCheckError(&local_338);
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (&__return_storage_ptr__->body_,
               (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
               (this->super_TVMPODValue_).value_.v_handle);
  }
  return __return_storage_ptr__;
}

Assistant:

operator PackedFunc() const {
    if (type_code_ == kNull)
      return PackedFunc();
    TVM_CHECK_TYPE_CODE(type_code_, kFuncHandle);
    return *ptr<PackedFunc>();
  }